

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O0

void __thiscall SensorBase::enable_buffer(SensorBase *this)

{
  value_type *path;
  path local_c0;
  path local_88;
  path local_60;
  undefined1 local_38 [8];
  path buffer_enable_path;
  SensorBase *this_local;
  
  buffer_enable_path._32_8_ = this;
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_88,(char (*) [7])"buffer",auto_format);
  std::filesystem::__cxx11::operator/(&local_60,&this->sysfspath,&local_88);
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_c0,(char (*) [7])"enable",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_38,&local_60,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::filesystem::__cxx11::path::~path(&local_88);
  path = std::filesystem::__cxx11::path::c_str((path *)local_38);
  writeint(path,1);
  std::filesystem::__cxx11::path::~path((path *)local_38);
  return;
}

Assistant:

void SensorBase::enable_buffer()
{
	using filesystem::path;
	
	path buffer_enable_path=sysfspath/"buffer"/"enable";
	writeint(buffer_enable_path.c_str(),1);
}